

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O3

char * __thiscall
testing::internal::UntypedFunctionMockerBase::Name(UntypedFunctionMockerBase *this)

{
  char *pcVar1;
  FailureReporterInterface *pFVar2;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  MutexBase::Lock((MutexBase *)g_gmock_mutex);
  pcVar1 = this->name_;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,
             "Name() must not be called before SetOwnerAndName() has been called.","");
  if (pcVar1 == (char *)0x0) {
    pFVar2 = GetFailureReporter();
    (*pFVar2->_vptr_FailureReporterInterface[2])
              (pFVar2,1,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/3rdparty/googletest/googlemock/src/gmock-spec-builders.cc"
               ,0x16d,local_38);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  pcVar1 = this->name_;
  MutexBase::Unlock((MutexBase *)g_gmock_mutex);
  return pcVar1;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
  const char* name;
  {
    // We protect name_ under g_gmock_mutex in case this mock
    // function is called from two threads concurrently.
    MutexLock l(&g_gmock_mutex);
    Assert(name_ != nullptr, __FILE__, __LINE__,
           "Name() must not be called before SetOwnerAndName() has "
           "been called.");
    name = name_;
  }
  return name;
}